

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O0

SHADER_STATUS __thiscall
Diligent::ShaderBase<Diligent::EngineGLImplTraits>::GetStatus
          (ShaderBase<Diligent::EngineGLImplTraits> *this,bool WaitForCompletion)

{
  SHADER_STATUS SVar1;
  Char *pCVar2;
  char (*in_RCX) [47];
  undefined1 local_68 [8];
  string msg_1;
  ASYNC_TASK_STATUS InitTaskStatus;
  undefined1 local_38 [8];
  string msg;
  bool WaitForCompletion_local;
  ShaderBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._M_local_buf[0xf] = WaitForCompletion;
  SVar1 = std::atomic<Diligent::SHADER_STATUS>::load(&this->m_Status,memory_order_seq_cst);
  if (SVar1 == SHADER_STATUS_UNINITIALIZED) {
    FormatString<char[26],char[47]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Status.load() != SHADER_STATUS_UNINITIALIZED",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetStatus",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0xa0);
    std::__cxx11::string::~string((string *)local_38);
  }
  msg_1.field_2._8_4_ =
       AsyncInitializer::Update(&this->m_AsyncInitializer,(bool)(msg.field_2._M_local_buf[0xf] & 1))
  ;
  if ((msg_1.field_2._8_4_ == ASYNC_TASK_STATUS_COMPLETE) &&
     (SVar1 = std::atomic<Diligent::SHADER_STATUS>::load(&this->m_Status,memory_order_seq_cst),
     SVar1 < SHADER_STATUS_READY)) {
    FormatString<char[78]>
              ((string *)local_68,
               (char (*) [78])
               "Shader status must be atomically set by the compiling task before it finishes");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetStatus",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0xa4);
    std::__cxx11::string::~string((string *)local_68);
  }
  SVar1 = std::atomic<Diligent::SHADER_STATUS>::load(&this->m_Status,memory_order_seq_cst);
  return SVar1;
}

Assistant:

GetStatus(bool WaitForCompletion) override
    {
        VERIFY_EXPR(m_Status.load() != SHADER_STATUS_UNINITIALIZED);
        ASYNC_TASK_STATUS InitTaskStatus = AsyncInitializer::Update(m_AsyncInitializer, WaitForCompletion);
        if (InitTaskStatus == ASYNC_TASK_STATUS_COMPLETE)
        {
            VERIFY(m_Status.load() > SHADER_STATUS_COMPILING, "Shader status must be atomically set by the compiling task before it finishes");
        }
        return m_Status.load();
    }